

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall
HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::growTable
          (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
           *this)

{
  bool bVar1;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int> *this_00;
  type puVar2;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int> *in_RDI;
  u64 i;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
  *in_stack_00000018;
  u64 oldCapactiy;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> oldMetadata;
  unique_ptr<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
  oldEntries;
  unique_ptr<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
  *in_stack_ffffffffffffffb8;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int> *local_38
  ;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffffd0;
  u64 in_stack_ffffffffffffffd8;
  
  std::
  unique_ptr<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
  ::unique_ptr(&in_RDI->entries,in_stack_ffffffffffffffb8);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI,
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_ffffffffffffffb8);
  this_00 = (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
             *)(in_RDI->tableSizeMask + 1);
  makeEmptyTable(this_00,in_stack_ffffffffffffffd8);
  for (local_38 = (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                   *)0x0; local_38 != this_00;
      local_38 = (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                  *)((long)&(local_38->entries)._M_t.
                            super___uniq_ptr_impl<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
                            .
                            super__Head_base<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_false>
                            ._M_head_impl + 1)) {
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI
                        ,(size_t)in_stack_ffffffffffffffb8);
    bVar1 = occupied(in_RDI,*puVar2);
    if (bVar1) {
      std::
      unique_ptr<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
      ::get(&in_RDI->entries);
      HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>::
      insert<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>>
                (in_stack_00000018,
                 (HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                  *)i);
    }
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (in_stack_ffffffffffffffd0);
  std::
  unique_ptr<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
  ::~unique_ptr(&in_RDI->entries);
  return;
}

Assistant:

void growTable() {
    decltype(entries) oldEntries = std::move(entries);
    decltype(metadata) oldMetadata = std::move(metadata);
    u64 oldCapactiy = tableSizeMask + 1;

    makeEmptyTable(2 * oldCapactiy);

    for (u64 i = 0; i != oldCapactiy; ++i)
      if (occupied(oldMetadata[i])) insert(std::move(oldEntries.get()[i]));
  }